

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O1

void Amap_ManCreate(Amap_Man_t *p,Aig_Man_t *pAig)

{
  void *pvVar1;
  Aig_Obj_t *pObj;
  uint *puVar2;
  Aig_Obj_t **ppAVar3;
  bool bVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  Amap_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  ulong uVar11;
  uint uVar12;
  Amap_Obj_t *pFan1_00;
  long lVar13;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Amap_Obj_t *pChoices [4];
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_68;
  Vec_Ptr_t *local_60;
  Amap_Obj_t *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  
  if (pAig->pEquivs == (Aig_Obj_t **)0x0) {
    pVVar7 = Aig_ManDfs(pAig,1);
  }
  else {
    pVVar7 = Aig_ManDfsChoices(pAig);
  }
  pAVar8 = Amap_ManSetupObj(p);
  *(ulong *)pAVar8 = *(ulong *)pAVar8 & 0xdffffffffffffff8 | 0x2000000000000001;
  p->nObjs[1] = p->nObjs[1] + 1;
  p->pConst1 = pAVar8;
  if ((p->pPars->fVerbose != 0) &&
     (0.1 < (double)(pAig->vObjs->nSize - pAig->nDeleted) * 96.0 * 9.313225746154785e-10)) {
    printf("Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n");
  }
  Aig_ManCleanData(pAig);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar9 = pAig->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar1 = pVVar9->pArray[lVar13];
      pAVar8 = Amap_ManCreatePi(p);
      *(Amap_Obj_t **)((long)pvVar1 + 0x28) = pAVar8;
      lVar13 = lVar13 + 1;
      pVVar9 = pAig->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    local_60 = pVVar7;
    do {
      pObj = (Aig_Obj_t *)local_60->pArray[lVar13];
      if ((p->fUseXor == 0) || (iVar6 = Aig_ObjRecognizeExor(pObj,&local_68,&local_70), iVar6 == 0))
      {
        bVar4 = true;
        if ((p->fUseMux != 0) && (iVar6 = Aig_ObjIsMuxType(pObj), iVar6 != 0)) {
          pAVar10 = Aig_ObjRecognizeMux(pObj,&local_70,&local_68);
          Amap_ManCreateMuxChoices
                    (p,(Amap_Obj_t *)
                       ((ulong)((uint)local_68 & 1) ^
                       *(ulong *)(((ulong)local_68 & 0xfffffffffffffffe) + 0x28)),
                     (Amap_Obj_t *)
                     ((ulong)((uint)local_70 & 1) ^
                     *(ulong *)(((ulong)local_70 & 0xfffffffffffffffe) + 0x28)),
                     (Amap_Obj_t *)
                     ((ulong)((uint)pAVar10 & 1) ^
                     *(ulong *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x28)),&local_58);
          goto LAB_0043fa04;
        }
      }
      else {
        Amap_ManCreateXorChoices
                  (p,(Amap_Obj_t *)
                     ((ulong)((uint)local_68 & 1) ^
                     *(ulong *)(((ulong)local_68 & 0xfffffffffffffffe) + 0x28)),
                   (Amap_Obj_t *)
                   ((ulong)((uint)local_70 & 1) ^
                   *(ulong *)(((ulong)local_70 & 0xfffffffffffffffe) + 0x28)),&local_58);
LAB_0043fa04:
        bVar4 = false;
      }
      if (((ulong)pObj & 1) != 0) goto LAB_0043fc77;
      uVar11 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        pAVar8 = (Amap_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Amap_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar11 + 0x28));
      }
      uVar11 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        pFan1_00 = (Amap_Obj_t *)0x0;
      }
      else {
        pFan1_00 = (Amap_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar11 + 0x28));
      }
      pAVar8 = Amap_ManCreateAnd(p,pAVar8,pFan1_00);
      (pObj->field_5).pData = pAVar8;
      if (!bVar4) {
        p->nChoicesAdded = p->nChoicesAdded + 1;
        puVar2 = (uint *)(pObj->field_5).pData;
        if (puVar2[5] != 0) {
LAB_0043fc58:
          __assert_fail("pObj->Equiv==0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapInt.h"
                        ,0x104,"void Amap_ObjSetChoice(Amap_Obj_t *, Amap_Obj_t *)");
        }
        if (*puVar2 >> 3 != *(uint *)local_58 >> 3) {
          puVar2[5] = *(uint *)local_58 >> 3;
        }
        if (local_58->Equiv != 0) goto LAB_0043fc58;
        if (*(uint *)local_58 >> 3 != *local_50 >> 3) {
          local_58->Equiv = *local_50 >> 3;
        }
        if (local_50[5] != 0) goto LAB_0043fc58;
        if (*local_50 >> 3 != *local_48 >> 3) {
          local_50[5] = *local_48 >> 3;
        }
        if (local_48[5] != 0) goto LAB_0043fc58;
        if (*local_48 >> 3 != *local_40 >> 3) {
          local_48[5] = *local_40 >> 3;
        }
        Amap_ManCreateChoice(p,(Amap_Obj_t *)(pObj->field_5).pData);
      }
      ppAVar3 = pAig->pEquivs;
      if (((ppAVar3 != (Aig_Obj_t **)0x0) && (ppAVar3[pObj->Id] != (Aig_Obj_t *)0x0)) &&
         ((*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0)) {
        p->nChoicesGiven = p->nChoicesGiven + 1;
        pAVar10 = pObj;
        if (ppAVar3 == (Aig_Obj_t **)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = ppAVar3[pObj->Id];
        }
        while (pAVar5 != (Aig_Obj_t *)0x0) {
          *(ulong *)(pAVar5->field_5).pData = *(pAVar5->field_5).pData & 0xbfffffffffffffff;
          pAVar8 = Amap_ManGetLast_rec(p,(Amap_Obj_t *)(pAVar10->field_5).pData);
          if (pAVar8->Equiv != 0) goto LAB_0043fc58;
          uVar12 = *(pAVar5->field_5).pData >> 3;
          if (*(uint *)pAVar8 >> 3 != uVar12) {
            pAVar8->Equiv = uVar12;
          }
          pAVar10 = pAVar5;
          if (pAig->pEquivs == (Aig_Obj_t **)0x0) {
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar5 = pAig->pEquivs[pAVar5->Id];
          }
        }
        Amap_ManCreateChoice(p,(Amap_Obj_t *)(pObj->field_5).pData);
      }
      lVar13 = lVar13 + 1;
      pVVar7 = local_60;
    } while (lVar13 < local_60->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (void **)0x0;
  }
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    free(pVVar7);
  }
  pVVar7 = pAig->vCos;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar13];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_0043fc77:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar11 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar11 == 0) {
        pAVar8 = (Amap_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Amap_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar11 + 0x28));
      }
      pAVar8 = Amap_ManCreatePo(p,pAVar8);
      *(Amap_Obj_t **)((long)pvVar1 + 0x28) = pAVar8;
      lVar13 = lVar13 + 1;
      pVVar7 = pAig->vCos;
    } while (lVar13 < pVVar7->nSize);
  }
  if (p->pPars->fVerbose != 0) {
    printf("Performing mapping with %d given and %d created choices.\n",
           (ulong)(uint)p->nChoicesGiven,(ulong)(uint)p->nChoicesAdded);
  }
  return;
}

Assistant:

void Amap_ManCreate( Amap_Man_t * p, Aig_Man_t * pAig )
{
    Vec_Ptr_t * vNodes;
    Amap_Obj_t * pChoices[4];
    Aig_Obj_t * pObj, * pFanin, * pPrev, * pFan0, * pFan1, * pFanC;
    int i, fChoices;
    if ( pAig->pEquivs )
        vNodes = Aig_ManDfsChoices( pAig );
    else
        vNodes = Aig_ManDfs( pAig, 1 );
    p->pConst1 = Amap_ManCreateConst1( p );
    // print warning about excessive memory usage
    if ( p->pPars->fVerbose )
    {
        if ( 1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30) > 0.1 )
        printf( "Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n", 
            1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30), Aig_ManObjNum(pAig) );
    }
    // create PIs and remember them in the old nodes
    Aig_ManCleanData(pAig);
    Aig_ManConst1(pAig)->pData = Amap_ManConst1( p );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePi( p );
    // load the AIG into the mapper
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fChoices = 0;
        if ( p->fUseXor && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1 ) )
        {
            Amap_ManCreateXorChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), pChoices );
            fChoices = 1;
        }
        else if ( p->fUseMux && Aig_ObjIsMuxType(pObj) )
        {
            pFanC = Aig_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            Amap_ManCreateMuxChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), Amap_AndToObj(pFanC), pChoices );
            fChoices = 1;
        }
        pObj->pData = Amap_ManCreateAnd( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj), (Amap_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( fChoices )
        {
            p->nChoicesAdded++;
            Amap_ObjSetChoice( (Amap_Obj_t *)pObj->pData, pChoices[0] );
            Amap_ObjSetChoice( pChoices[0], pChoices[1] );
            Amap_ObjSetChoice( pChoices[1], pChoices[2] );
            Amap_ObjSetChoice( pChoices[2], pChoices[3] );
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
        if ( Aig_ObjIsChoice( pAig, pObj ) )
        {
//            assert( !fChoices );
            p->nChoicesGiven++;
            for ( pPrev = pObj, pFanin = Aig_ObjEquiv(pAig, pObj); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(pAig, pFanin) )
            {
                ((Amap_Obj_t *)pFanin->pData)->fRepr = 0;
                Amap_ObjSetChoice( Amap_ManGetLast_rec(p, (Amap_Obj_t *)pPrev->pData), 
                    (Amap_Obj_t *)pFanin->pData );
            }
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
    }
    Vec_PtrFree( vNodes );
    // set the primary outputs without copying the phase
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePo( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->fVerbose )
        printf( "Performing mapping with %d given and %d created choices.\n", 
            p->nChoicesGiven, p->nChoicesAdded );
}